

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line_property.c
# Opt level: O0

int setPosition(float *val,mpt_convertable *src)

{
  int iVar1;
  double dStack_28;
  int len;
  double tmp;
  mpt_convertable *src_local;
  float *val_local;
  
  if (src == (mpt_convertable *)0x0) {
    *val = 0.0;
    val_local._4_4_ = 0;
  }
  else {
    tmp = (double)src;
    src_local = (mpt_convertable *)val;
    iVar1 = (*src->_vptr->convert)(src,0x66,val);
    if (iVar1 < 0) {
      iVar1 = (*(code *)**(undefined8 **)tmp)(tmp,100,&stack0xffffffffffffffd8);
      if (iVar1 < 0) {
        val_local._4_4_ = -3;
      }
      else {
        if (iVar1 == 0) {
          *(undefined4 *)&src_local->_vptr = 0;
        }
        else {
          *(float *)&src_local->_vptr = (float)dStack_28;
        }
        val_local._4_4_ = 0;
      }
    }
    else {
      if (iVar1 == 0) {
        *(undefined4 *)&src_local->_vptr = 0;
      }
      val_local._4_4_ = 0;
    }
  }
  return val_local._4_4_;
}

Assistant:

static int setPosition(float *val, MPT_INTERFACE(convertable) *src)
{
	double tmp;
	int len;
	if (!src) {
		*val = 0;
		return 0;
	}
	if ((len = src->_vptr->convert(src, 'f', val)) >= 0) {
		if (!len) *val = 0.0f;
		return 0;
	}
	if ((len = src->_vptr->convert(src, 'd', &tmp)) >= 0) {
		if (!len) {
			*val = 0.0f;
		} else {
			*val = tmp;
		}
		return 0;
	}
	return MPT_ERROR(BadType);
}